

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Exp(FParser *this)

{
  bool bVar1;
  double dVar2;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    dVar2 = floatvalue(this->t_argv);
    dVar2 = c_exp(dVar2);
    svalue_t::setDouble(&this->t_return,dVar2);
  }
  return;
}

Assistant:

void FParser::SF_Exp()
{
	if (CheckArgs(1))
	{
		t_return.setDouble(g_exp(floatvalue(t_argv[0])));
	}
}